

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLDocumentProcessor.h
# Opt level: O3

void __thiscall COLLADASaxFWL::DocumentProcessor::addCamera(DocumentProcessor *this,Camera *camera)

{
  vector<COLLADAFW::Camera*,std::allocator<COLLADAFW::Camera*>> *this_00;
  iterator __position;
  Camera *local_8;
  
  this_00 = (vector<COLLADAFW::Camera*,std::allocator<COLLADAFW::Camera*>> *)this->mCameras;
  __position._M_current = *(Camera ***)(this_00 + 8);
  if (__position._M_current == *(Camera ***)(this_00 + 0x10)) {
    local_8 = camera;
    std::vector<COLLADAFW::Camera*,std::allocator<COLLADAFW::Camera*>>::
    _M_realloc_insert<COLLADAFW::Camera*const&>(this_00,__position,&local_8);
  }
  else {
    *__position._M_current = camera;
    *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
  }
  return;
}

Assistant:

void addCamera( COLLADAFW::Camera* camera ) { mCameras.push_back(camera); }